

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O2

bool __thiscall
ON_TextureMapping::HasMatchingTextureCoordinates
          (ON_TextureMapping *this,ON_MappingTag *tag,ON_Xform *mesh_xform)

{
  double *pdVar1;
  double *pdVar2;
  ON__UINT32 OVar3;
  bool bVar4;
  ON__UINT32 OVar5;
  long lVar6;
  bool bVar7;
  
  OVar3 = tag->m_mapping_crc;
  OVar5 = MappingCRC(this);
  if (OVar3 == OVar5) {
    bVar7 = true;
    if ((((mesh_xform != (ON_Xform *)0x0) && (this->m_type != srfp_mapping)) &&
        (bVar4 = ON_Xform::IsValid(mesh_xform), bVar4)) &&
       (bVar4 = ON_Xform::IsZero(mesh_xform), !bVar4)) {
      bVar4 = ON_Xform::IsZero(&tag->m_mesh_xform);
      if (!bVar4) {
        lVar6 = 0;
        do {
          bVar7 = (int)lVar6 == 0x10;
          if (bVar7) {
            return bVar7;
          }
          pdVar1 = mesh_xform->m_xform[0] + lVar6;
          pdVar2 = (tag->m_mesh_xform).m_xform[0] + lVar6;
          lVar6 = lVar6 + 1;
        } while (ABS(*pdVar1 - *pdVar2) <= 1.490116119385e-08);
      }
    }
  }
  else {
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool ON_TextureMapping::HasMatchingTextureCoordinates(
       const ON_MappingTag& tag,
       const ON_Xform* mesh_xform
       ) const
{
  bool rc = false;

  // DO NOT COMPARE m_mapping_id's in this function.
  // This function returns true if the tc values
  // calculated by the mapping will be the same
  // as the mapping that was used to set the tag.
  if ( tag.m_mapping_crc == MappingCRC() )
  {
    rc = true;

    // zero transformations indicate the mapping
    // values are independent of the 3d location
    // of the mesh.  The ON_TextureMapping::TYPE::srfp_mapping != m_type
    // check is used because these mappings are
    // always independent of 3d location but
    // the transformations are often set.
    if ( ON_TextureMapping::TYPE::srfp_mapping != m_type
         && mesh_xform
         && mesh_xform->IsValid()
         && !mesh_xform->IsZero()
         && !tag.m_mesh_xform.IsZero()
       )
    {
      // compare xforms - these can have a bit of slop
      const double* a = &mesh_xform->m_xform[0][0];
      const double* b = &tag.m_mesh_xform.m_xform[0][0];
      for ( int i = 16; i--; /*empty*/ )
      {
        if ( fabs(*a++ - *b++) > ON_SQRT_EPSILON )
        {
          rc = false;
          break;
        }
      }
    }
  }

  return rc;
}